

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  TestResult *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ostream *poVar3;
  TestPartResult *pTVar4;
  int line;
  int width;
  int width_00;
  int width_01;
  int width_02;
  char *pcVar5;
  TimeInMillis ms;
  int iVar6;
  _Alloc_hider _Var7;
  char *pcVar8;
  internal *this_00;
  int i;
  string location;
  string message;
  string kIndent;
  string kTestcase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  TestInfo *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&kTestcase,"testcase",(allocator *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0xa,width);
  Indent_abi_cxx11_(&location,(internal *)0x8,width_00);
  poVar3 = std::operator<<(stream,(string *)&location);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string((string *)&location,"name",(allocator *)&local_78);
  std::__cxx11::string::string
            ((string *)&message,(test_info->name_)._M_dataplus._M_p,(allocator *)&local_50);
  OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
  std::__cxx11::string::~string((string *)&message);
  std::__cxx11::string::~string((string *)&location);
  pbVar1 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string((string *)&location,"value_param",(allocator *)&local_78);
    pbVar1 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var7._M_p = (char *)0x0;
    }
    else {
      _Var7._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&message,_Var7._M_p,(allocator *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
  }
  pbVar1 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string((string *)&location,"type_param",(allocator *)&local_78);
    pbVar1 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var7._M_p = (char *)0x0;
    }
    else {
      _Var7._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&message,_Var7._M_p,(allocator *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    std::__cxx11::string::string((string *)&location,"file",(allocator *)&local_78);
    std::__cxx11::string::string
              ((string *)&message,(test_info->location_).file._M_dataplus._M_p,
               (allocator *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string((string *)&location,"line",(allocator *)&message);
    OutputJsonKey(stream,&kTestcase,&location,(test_info->location_).line,&kIndent,false);
    std::__cxx11::string::~string((string *)&location);
    poVar3 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&location,(internal *)0x8,width_01);
    poVar3 = std::operator<<(poVar3,(string *)&location);
    std::operator<<(poVar3,"}");
  }
  else {
    std::__cxx11::string::string((string *)&location,"status",(allocator *)&local_78);
    this = &test_info->result_;
    bVar2 = TestResult::Skipped(this);
    pcVar5 = "NOTRUN";
    if ((test_info->should_run_ & 1U) != 0) {
      pcVar5 = "RUN";
    }
    pcVar8 = "SKIPPED";
    if (!bVar2) {
      pcVar8 = pcVar5;
    }
    std::__cxx11::string::string((string *)&message,pcVar8,(allocator *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string((string *)&location,"time",(allocator *)&local_78);
    FormatTimeInMillisAsDuration_abi_cxx11_
              (&message,(internal *)(test_info->result_).elapsed_time_,ms);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string((string *)&location,"classname",(allocator *)&local_78);
    std::__cxx11::string::string((string *)&message,test_case_name,(allocator *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,false);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
    TestPropertiesAsJson(&location,this,&kIndent);
    local_58 = test_info;
    std::operator<<(stream,(string *)&location);
    std::__cxx11::string::~string((string *)&location);
    iVar6 = 0;
    i = 0;
    while( true ) {
      line = 0x70;
      if ((int)(((long)(local_58->result_).test_part_results_.
                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_58->result_).test_part_results_.
                      super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= i) break;
      pTVar4 = TestResult::GetTestPartResult(this,i);
      if (pTVar4->type_ - kNonFatalFailure < 2) {
        std::operator<<(stream,",\n");
        if (iVar6 == 0) {
          poVar3 = std::operator<<(stream,(string *)&kIndent);
          poVar3 = std::operator<<(poVar3,"\"");
          poVar3 = std::operator<<(poVar3,"failures");
          std::operator<<(poVar3,"\": [\n");
        }
        this_00 = (internal *)(pTVar4->file_name_)._M_string_length;
        if (this_00 != (internal *)0x0) {
          this_00 = (internal *)(pTVar4->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&location,this_00,(char *)(ulong)(uint)pTVar4->line_number_,line);
        std::operator+(&local_50,&location,"\n");
        std::operator+(&local_78,&local_50,(pTVar4->message_)._M_dataplus._M_p);
        EscapeJson(&message,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_50);
        poVar3 = std::operator<<(stream,(string *)&kIndent);
        poVar3 = std::operator<<(poVar3,"  {\n");
        poVar3 = std::operator<<(poVar3,(string *)&kIndent);
        poVar3 = std::operator<<(poVar3,"    \"failure\": \"");
        poVar3 = std::operator<<(poVar3,(string *)&message);
        poVar3 = std::operator<<(poVar3,"\",\n");
        poVar3 = std::operator<<(poVar3,(string *)&kIndent);
        poVar3 = std::operator<<(poVar3,"    \"type\": \"\"\n");
        poVar3 = std::operator<<(poVar3,(string *)&kIndent);
        std::operator<<(poVar3,"  }");
        iVar6 = iVar6 + 1;
        std::__cxx11::string::~string((string *)&message);
        std::__cxx11::string::~string((string *)&location);
      }
      i = i + 1;
    }
    if (0 < iVar6) {
      poVar3 = std::operator<<(stream,"\n");
      poVar3 = std::operator<<(poVar3,(string *)&kIndent);
      std::operator<<(poVar3,"]");
    }
    poVar3 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&location,(internal *)0x8,width_02);
    poVar3 = std::operator<<(poVar3,(string *)&location);
    std::operator<<(poVar3,"}");
  }
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestcase);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_case_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestcase, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestcase, "value_param",
                  test_info.value_param(), kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestcase, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestcase, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestcase, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestcase, "status",
                result.Skipped() ? "SKIPPED" :
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestcase, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestcase, "classname", test_case_name, kIndent, false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}